

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::eliminateNucleus(CLUFactor<double> *this,double eps,double threshold)

{
  int *in_RDI;
  double in_XMM0_Qa;
  CLUFactor<double> *unaff_retaddr;
  Pring *pivot;
  int c;
  int r;
  int iVar1;
  int iVar2;
  int *in_stack_ffffffffffffffd8;
  int iVar3;
  int iVar4;
  int *piVar5;
  
  if (*in_RDI != 2) {
    in_RDI[0x8a] = -1;
    in_RDI[0x88] = -1;
    in_RDI[0x89] = -1;
    piVar5 = in_RDI;
    do {
      if (in_RDI[1] + -1 <= in_RDI[0x82]) {
        if (in_RDI[1] <= in_RDI[0x82]) {
          return;
        }
        iVar2 = *(int *)(*(long *)(*(long *)(in_RDI + 0x92) + 0x20) + 0x10);
        iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 0x8e) + 0x20) + 0x10);
        *(undefined4 *)(*(long *)(in_RDI + 0x52) + (long)iVar2 * 4) = 0;
        *(int *)(*(long *)(in_RDI + 0x6a) + (long)iVar1 * 4) =
             *(int *)(*(long *)(in_RDI + 0x6a) + (long)iVar1 * 4) + -1;
        iVar3 = iVar1;
        iVar4 = iVar2;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),
                   (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)iVar2 * 4));
        setPivot((CLUFactor<double> *)CONCAT44(iVar4,iVar3),
                 (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8,
                 (int)((ulong)in_RDI >> 0x20),(double)CONCAT44(iVar2,iVar1));
        return;
      }
      if (*(long *)(*(long *)(in_RDI + 0x92) + 0x20) == *(long *)(in_RDI + 0x92) + 0x20) {
        if (*(long *)(*(long *)(in_RDI + 0x8e) + 0x20) == *(long *)(in_RDI + 0x8e) + 0x20) {
          *(int **)(in_RDI + 0x84) = in_RDI + 0x84;
          *(int **)(in_RDI + 0x86) = in_RDI + 0x84;
          selectPivots(this,eps);
          for (in_stack_ffffffffffffffd8 = *(int **)(in_RDI + 0x84);
              in_stack_ffffffffffffffd8 != in_RDI + 0x84;
              in_stack_ffffffffffffffd8 = *(int **)in_stack_ffffffffffffffd8) {
            eliminatePivot(unaff_retaddr,(int)((ulong)piVar5 >> 0x20),(int)piVar5,in_XMM0_Qa);
          }
        }
        else {
          eliminateColSingletons(unaff_retaddr);
        }
      }
      else {
        eliminateRowSingletons((CLUFactor<double> *)pivot);
      }
    } while ((**(long **)(in_RDI + 0x92) == *(long *)(in_RDI + 0x92)) &&
            (**(long **)(in_RDI + 0x8e) == *(long *)(in_RDI + 0x8e)));
    *in_RDI = 2;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminateNucleus(const R eps,
                                    const R threshold)
{
   int r, c;
   CLUFactor<R>::Pring* pivot;

   if(this->stat == SLinSolver<R>::SINGULAR)
      return;

   temp.pivots.mkwtz = -1;

   temp.pivots.idx = -1;

   temp.pivots.pos = -1;

   while(temp.stage < thedim - 1)
   {
#ifndef NDEBUG
      int i;
      // CLUFactorIsConsistent(fac);

      for(i = 0; i < thedim; ++i)
         if(col.perm[i] < 0)
            assert(temp.s_mark[i] == 0);

#endif

      if(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]))
         /* row singleton available */
         eliminateRowSingletons();
      else if(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]))
         /* column singleton available */
         eliminateColSingletons();
      else
      {
         initDR(temp.pivots);
         selectPivots(threshold);

         assert(temp.pivots.next != &temp.pivots &&
                "ERROR: no pivot element selected");

         for(pivot = temp.pivots.next; pivot != &temp.pivots;
               pivot = pivot->next)
         {
            eliminatePivot(pivot->idx, pivot->pos, eps);
         }
      }

      if(temp.pivot_rowNZ->next != temp.pivot_rowNZ ||
            temp.pivot_colNZ->next != temp.pivot_colNZ)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   if(temp.stage < thedim)
   {
      /*      Eliminate remaining element.
       *      Note, that this must be both, column and row singleton.
       */
      assert(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]) &&
             "ERROR: one row must be left");
      assert(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]) &&
             "ERROR: one col must be left");
      r = temp.pivot_rowNZ[1].next->idx;
      c = temp.pivot_colNZ[1].next->idx;
      u.row.len[r] = 0;
      u.col.len[c]--;
      setPivot(temp.stage, c, r, u.row.val[u.row.start[r]]);
   }
}